

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

int xmlListPushFront(xmlListPtr l,void *data)

{
  xmlLinkPtr pxVar1;
  _xmlLink *p_Var2;
  int iVar3;
  
  iVar3 = 0;
  if (l != (xmlListPtr)0x0) {
    pxVar1 = l->sentinel;
    p_Var2 = (_xmlLink *)(*xmlMalloc)(0x18);
    iVar3 = 0;
    if (p_Var2 != (_xmlLink *)0x0) {
      p_Var2->data = data;
      p_Var2->next = pxVar1->next;
      pxVar1->next->prev = p_Var2;
      pxVar1->next = p_Var2;
      p_Var2->prev = pxVar1;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int
xmlListPushFront(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(0);
    lkPlace = l->sentinel;
    /* Add the new link */
    lkNew = (xmlLinkPtr) xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL)
        return (0);
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 1;
}